

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf_def.c
# Opt level: O0

int def_load(CONF *conf,char *name,long *line)

{
  int iVar1;
  BIO *a;
  ulong errcode;
  char *in_RDX;
  char *in_RSI;
  BIO *in;
  int ret;
  long *in_stack_000000e8;
  BIO *in_stack_000000f0;
  CONF *in_stack_000000f8;
  int in_stack_ffffffffffffffdc;
  int local_4;
  
  a = BIO_new_file(in_RSI,"rb");
  if (a == (BIO *)0x0) {
    errcode = ERR_peek_last_error();
    iVar1 = ERR_GET_REASON(errcode);
    if (iVar1 == 0x80) {
      ERR_new();
      ERR_set_debug(in_RDX,in_stack_ffffffffffffffdc,(char *)a);
      ERR_set_error(0xe,0x72,(char *)0x0);
    }
    else {
      ERR_new();
      ERR_set_debug(in_RDX,in_stack_ffffffffffffffdc,(char *)a);
      ERR_set_error(0xe,0x80002,(char *)0x0);
    }
    local_4 = 0;
  }
  else {
    local_4 = def_load_bio(in_stack_000000f8,in_stack_000000f0,in_stack_000000e8);
    BIO_free(a);
  }
  return local_4;
}

Assistant:

static int def_load(CONF *conf, const char *name, long *line)
{
    int ret;
    BIO *in = NULL;

#ifdef OPENSSL_SYS_VMS
    in = BIO_new_file(name, "r");
#else
    in = BIO_new_file(name, "rb");
#endif
    if (in == NULL) {
        if (ERR_GET_REASON(ERR_peek_last_error()) == BIO_R_NO_SUCH_FILE)
            ERR_raise(ERR_LIB_CONF, CONF_R_NO_SUCH_FILE);
        else
            ERR_raise(ERR_LIB_CONF, ERR_R_SYS_LIB);
        return 0;
    }

    ret = def_load_bio(conf, in, line);
    BIO_free(in);

    return ret;
}